

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UnknownModuleSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnknownModuleSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::basic_string_view<char,std::char_traits<char>>&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,basic_string_view<char,_std::char_traits<char>_> *args_2,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_3)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  pointer ppEVar6;
  size_type sVar7;
  UnknownModuleSymbol *pUVar8;
  
  pUVar8 = (UnknownModuleSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UnknownModuleSymbol *)this->endPtr < pUVar8 + 1) {
    pUVar8 = (UnknownModuleSymbol *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pUVar8 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  sVar4 = args_2->_M_len;
  pcVar5 = args_2->_M_str;
  ppEVar6 = args_3->data_;
  sVar7 = args_3->size_;
  (pUVar8->super_Symbol).kind = UnknownModule;
  (pUVar8->super_Symbol).name._M_len = sVar2;
  (pUVar8->super_Symbol).name._M_str = pcVar3;
  (pUVar8->super_Symbol).location = SVar1;
  (pUVar8->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pUVar8->super_Symbol).parentScope = (Scope *)0x0;
  (pUVar8->super_Symbol).nextInScope = (Symbol *)0x0;
  (pUVar8->super_Symbol).indexInScope = 0;
  (pUVar8->moduleName)._M_len = sVar4;
  (pUVar8->moduleName)._M_str = pcVar5;
  (pUVar8->paramExpressions).data_ = ppEVar6;
  (pUVar8->paramExpressions).size_ = sVar7;
  (pUVar8->ports).
  super__Optional_base<nonstd::span_lite::span<const_slang::ast::AssertionExpr_*const,_18446744073709551615UL>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::AssertionExpr_*const,_18446744073709551615UL>_>
  ._M_engaged = false;
  (pUVar8->portNames).data_ = (pointer)0x0;
  (pUVar8->portNames).size_ = 0;
  pUVar8->mustBeChecker = false;
  return pUVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }